

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

int __thiscall crnd::prefix_coding::decoder_tables::init(decoder_tables *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  uint32 uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint32 uVar8;
  unsigned_short *puVar9;
  uint *puVar10;
  byte bVar11;
  byte bVar12;
  uint in_ECX;
  long in_RDX;
  uint local_174;
  uint local_170;
  uint32 j_1;
  uint32 i_4;
  uint32 i_3;
  uint32 t;
  uint32 j;
  uint32 sym_index;
  uint32 code;
  uint32 val_ptr;
  uint32 max_code;
  uint32 min_code;
  uint32 fillnum;
  uint32 fillsize;
  uint32 codesize;
  uint32 table_size;
  uint32 sorted_pos;
  uint32 c_1;
  uint32 i_2;
  uint32 n;
  uint32 i_1;
  uint32 min_code_size;
  uint32 max_code_size;
  uint32 total_used_syms;
  uint32 cur_code;
  uint32 sorted_positions [17];
  uint local_cc;
  uint32 c;
  uint32 i;
  uint32 num_codes [17];
  uint32 auStack_78 [2];
  uint32 min_codes [16];
  uint local_2c;
  uint32 table_bits_local;
  uint8 *pCodesizes_local;
  uint32 num_syms_local;
  decoder_tables *this_local;
  
  uVar7 = (uint)ctx;
  if ((uVar7 == 0) || (0xb < in_ECX)) {
    this_local._7_1_ = 0;
  }
  else {
    this->m_num_syms = uVar7;
    utils::zero_object<unsigned_int[17]>((uint (*) [17])&c);
    for (local_cc = 0; local_cc < uVar7; local_cc = local_cc + 1) {
      sorted_positions[0x10] = (uint32)*(byte *)(in_RDX + (ulong)local_cc);
      if (sorted_positions[0x10] != 0) {
        (&c)[sorted_positions[0x10]] = (&c)[sorted_positions[0x10]] + 1;
      }
    }
    max_code_size = 0;
    min_code_size = 0;
    i_1 = 0;
    n = 0xffffffff;
    for (i_2 = 1; i_2 < 0x11; i_2 = i_2 + 1) {
      uVar2 = (&c)[i_2];
      if (uVar2 == 0) {
        this->m_max_codes[i_2 - 1] = 0;
      }
      else {
        n = math::minimum<unsigned_int>(n,i_2);
        i_1 = math::maximum<unsigned_int>(i_1,i_2);
        auStack_78[i_2 - 1] = max_code_size;
        this->m_max_codes[i_2 - 1] = (max_code_size + uVar2) - 1;
        this->m_max_codes[i_2 - 1] =
             (this->m_max_codes[i_2 - 1] << (0x10U - (char)i_2 & 0x1f) |
             (1 << (0x10U - (char)i_2 & 0x1f)) - 1U) + 1;
        this->m_val_ptrs[i_2 - 1] = min_code_size;
        (&total_used_syms)[i_2] = min_code_size;
        max_code_size = uVar2 + max_code_size;
        min_code_size = uVar2 + min_code_size;
      }
      max_code_size = max_code_size << 1;
    }
    this->m_total_used_syms = min_code_size;
    if (this->m_cur_sorted_symbol_order_size < min_code_size) {
      this->m_cur_sorted_symbol_order_size = min_code_size;
      bVar5 = math::is_power_of_2(min_code_size);
      if (!bVar5) {
        uVar6 = math::next_pow2(min_code_size);
        uVar6 = math::minimum<unsigned_int>(uVar7,uVar6);
        this->m_cur_sorted_symbol_order_size = uVar6;
      }
      if (this->m_sorted_symbol_order != (uint16 *)0x0) {
        crnd_delete_array<unsigned_short>(this->m_sorted_symbol_order);
      }
      puVar9 = crnd_new_array<unsigned_short>(this->m_cur_sorted_symbol_order_size);
      this->m_sorted_symbol_order = puVar9;
      if (this->m_sorted_symbol_order == (uint16 *)0x0) {
        this_local._7_1_ = 0;
        goto LAB_0011c048;
      }
    }
    this->m_min_code_size = (uint8)n;
    this->m_max_code_size = (uint8)i_1;
    for (sorted_pos = 0; sorted_pos < uVar7; sorted_pos = sorted_pos + 1) {
      uVar6 = (uint)*(byte *)(in_RDX + (ulong)sorted_pos);
      if (uVar6 != 0) {
        uVar3 = (&total_used_syms)[uVar6];
        (&total_used_syms)[uVar6] = uVar3 + 1;
        this->m_sorted_symbol_order[uVar3] = (uint16)sorted_pos;
      }
    }
    local_2c = in_ECX;
    if (in_ECX <= this->m_min_code_size) {
      local_2c = 0;
    }
    this->m_table_bits = local_2c;
    if (local_2c != 0) {
      bVar11 = (byte)local_2c;
      uVar7 = 1 << (bVar11 & 0x1f);
      if (this->m_cur_lookup_size < uVar7) {
        this->m_cur_lookup_size = uVar7;
        if (this->m_lookup != (uint32 *)0x0) {
          crnd_delete_array<unsigned_int>(this->m_lookup);
        }
        puVar10 = crnd_new_array<unsigned_int>(uVar7);
        this->m_lookup = puVar10;
        if (this->m_lookup == (uint32 *)0x0) {
          this_local._7_1_ = 0;
          goto LAB_0011c048;
        }
      }
      memset(this->m_lookup,0xff,(1L << (bVar11 & 0x3f)) << 2);
      for (fillnum = 1; fillnum <= local_2c; fillnum = fillnum + 1) {
        if ((&c)[fillnum] != 0) {
          bVar12 = bVar11 - (char)fillnum;
          uVar2 = auStack_78[fillnum - 1];
          uVar8 = get_unshifted_max_code(this,fillnum);
          iVar4 = this->m_val_ptrs[fillnum - 1];
          for (j = uVar2; j <= uVar8; j = j + 1) {
            uVar1 = this->m_sorted_symbol_order[(iVar4 + j) - uVar2];
            for (i_3 = 0; i_3 < (uint)(1 << (bVar12 & 0x1f)); i_3 = i_3 + 1) {
              this->m_lookup[i_3 + (j << (bVar12 & 0x1f))] = (uint)uVar1 | fillnum << 0x10;
            }
          }
        }
      }
    }
    for (j_1 = 0; j_1 < 0x10; j_1 = j_1 + 1) {
      this->m_val_ptrs[j_1] = this->m_val_ptrs[j_1] - auStack_78[j_1];
    }
    this->m_table_max_code = 0;
    this->m_decode_start_code_size = (uint)this->m_min_code_size;
    if (local_2c != 0) {
      for (local_170 = local_2c; local_170 != 0; local_170 = local_170 - 1) {
        if ((&c)[local_170] != 0) {
          this->m_table_max_code = this->m_max_codes[local_170 - 1];
          break;
        }
      }
      if (local_170 != 0) {
        this->m_decode_start_code_size = local_2c + 1;
        do {
          local_174 = local_2c + 1;
          if (i_1 < local_174) goto LAB_0011c021;
          local_2c = local_174;
        } while ((&c)[local_174] == 0);
        this->m_decode_start_code_size = local_174;
      }
    }
LAB_0011c021:
    this->m_max_codes[0x10] = 0xffffffff;
    this->m_val_ptrs[0x10] = 0xfffff;
    this->m_table_shift = 0x20 - this->m_table_bits;
    this_local._7_1_ = 1;
  }
LAB_0011c048:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool decoder_tables::init(uint32 num_syms, const uint8* pCodesizes, uint32 table_bits)
        {
            uint32 min_codes[cMaxExpectedCodeSize];
            if ((!num_syms) || (table_bits > cMaxTableBits))
                return false;

            m_num_syms = num_syms;

            uint32 num_codes[cMaxExpectedCodeSize + 1];
            utils::zero_object(num_codes);

            for (uint32 i = 0; i < num_syms; i++)
            {
                uint32 c = pCodesizes[i];
                if (c)
                    num_codes[c]++;
            }

            uint32 sorted_positions[cMaxExpectedCodeSize + 1];

            uint32 cur_code = 0;

            uint32 total_used_syms = 0;
            uint32 max_code_size = 0;
            uint32 min_code_size = cUINT32_MAX;
            for (uint32 i = 1; i <= cMaxExpectedCodeSize; i++)
            {
                const uint32 n = num_codes[i];

                if (!n)
                    m_max_codes[i - 1] = 0; //UINT_MAX;
                else
                {
                    min_code_size = math::minimum(min_code_size, i);
                    max_code_size = math::maximum(max_code_size, i);

                    min_codes[i - 1] = cur_code;

                    m_max_codes[i - 1] = cur_code + n - 1;
                    m_max_codes[i - 1] = 1 + ((m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

                    m_val_ptrs[i - 1] = total_used_syms;

                    sorted_positions[i] = total_used_syms;

                    cur_code += n;
                    total_used_syms += n;
                }

                cur_code <<= 1;
            }

            m_total_used_syms = total_used_syms;

            if (total_used_syms > m_cur_sorted_symbol_order_size)
            {
                m_cur_sorted_symbol_order_size = total_used_syms;

                if (!math::is_power_of_2(total_used_syms))
                    m_cur_sorted_symbol_order_size = math::minimum<uint32>(num_syms, math::next_pow2(total_used_syms));

                if (m_sorted_symbol_order)
                    crnd_delete_array(m_sorted_symbol_order);

                m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
                if (!m_sorted_symbol_order)
                    return false;
            }

            m_min_code_size = static_cast<uint8>(min_code_size);
            m_max_code_size = static_cast<uint8>(max_code_size);

            for (uint32 i = 0; i < num_syms; i++)
            {
                uint32 c = pCodesizes[i];
                if (c)
                {
                    CRND_ASSERT(num_codes[c]);

                    uint32 sorted_pos = sorted_positions[c]++;

                    CRND_ASSERT(sorted_pos < total_used_syms);

                    m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
                }
            }

            if (table_bits <= m_min_code_size)
                table_bits = 0;
            m_table_bits = table_bits;

            if (table_bits)
            {
                uint32 table_size = 1 << table_bits;
                if (table_size > m_cur_lookup_size)
                {
                    m_cur_lookup_size = table_size;

                    if (m_lookup)
                        crnd_delete_array(m_lookup);

                    m_lookup = crnd_new_array<uint32>(table_size);
                    if (!m_lookup)
                        return false;
                }

                memset(m_lookup, 0xFF, (uint)sizeof(m_lookup[0]) * (1UL << table_bits));

                for (uint32 codesize = 1; codesize <= table_bits; codesize++)
                {
                    if (!num_codes[codesize])
                        continue;

                    const uint32 fillsize = table_bits - codesize;
                    const uint32 fillnum = 1 << fillsize;

                    const uint32 min_code = min_codes[codesize - 1];
                    const uint32 max_code = get_unshifted_max_code(codesize);
                    const uint32 val_ptr = m_val_ptrs[codesize - 1];

                    for (uint32 code = min_code; code <= max_code; code++)
                    {
                        const uint32 sym_index = m_sorted_symbol_order[val_ptr + code - min_code];
                        CRND_ASSERT(pCodesizes[sym_index] == codesize);

                        for (uint32 j = 0; j < fillnum; j++)
                        {
                            const uint32 t = j + (code << fillsize);

                            CRND_ASSERT(t < (1U << table_bits));

                            CRND_ASSERT(m_lookup[t] == cUINT32_MAX);

                            m_lookup[t] = sym_index | (codesize << 16U);
                        }
                    }
                }
            }

            for (uint32 i = 0; i < cMaxExpectedCodeSize; i++)
                m_val_ptrs[i] -= min_codes[i];

            m_table_max_code = 0;
            m_decode_start_code_size = m_min_code_size;

            if (table_bits)
            {
                uint32 i;
                for (i = table_bits; i >= 1; i--)
                {
                    if (num_codes[i])
                    {
                        m_table_max_code = m_max_codes[i - 1];
                        break;
                    }
                }
                if (i >= 1)
                {
                    m_decode_start_code_size = table_bits + 1;
                    for (uint32 j = table_bits + 1; j <= max_code_size; j++)
                    {
                        if (num_codes[j])
                        {
                            m_decode_start_code_size = j;
                            break;
                        }
                    }
                }
            }

            // sentinels
            m_max_codes[cMaxExpectedCodeSize] = cUINT32_MAX;
            m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

            m_table_shift = 32 - m_table_bits;
            return true;
        }